

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

Chainstate * __thiscall ChainstateManager::GetChainstateForIndexing(ChainstateManager *this)

{
  long lVar1;
  size_type sVar2;
  long in_RDI;
  long in_FS_OFFSET;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *in_stack_ffffffffffffff98;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *in_stack_ffffffffffffffa8;
  undefined8 local_50;
  ChainstateManager *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetAll(in_stack_ffffffffffffffe8);
  sVar2 = std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::size(in_stack_ffffffffffffff98);
  if (sVar2 < 2) {
    local_50 = *(type *)(in_RDI + 0x10);
  }
  else {
    local_50 = std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator*
                         (in_stack_ffffffffffffffa8);
  }
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_50;
  }
  __stack_chk_fail();
}

Assistant:

Chainstate& ChainstateManager::GetChainstateForIndexing()
{
    // We can't always return `m_ibd_chainstate` because after background validation
    // has completed, `m_snapshot_chainstate == m_active_chainstate`, but it can be
    // indexed.
    return (this->GetAll().size() > 1) ? *m_ibd_chainstate : *m_active_chainstate;
}